

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O2

bool check_owner_password_V5(string *owner_password,EncryptionData *data)

{
  __type_conflict2 _Var1;
  string password;
  string validation_salt;
  string user_data;
  string owner_data;
  string local_40;
  
  std::__cxx11::string::substr((ulong)&user_data,(ulong)&data->U);
  std::__cxx11::string::substr((ulong)&owner_data,(ulong)&data->O);
  std::__cxx11::string::substr((ulong)&validation_salt,(ulong)&data->O);
  truncate_password_V5(&password,owner_password);
  hash_V5(&local_40,&password,&validation_salt,&user_data,data);
  _Var1 = std::operator==(&local_40,&owner_data);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&password);
  std::__cxx11::string::~string((string *)&validation_salt);
  std::__cxx11::string::~string((string *)&owner_data);
  std::__cxx11::string::~string((string *)&user_data);
  return _Var1;
}

Assistant:

static bool
check_owner_password_V5(std::string const& owner_password, QPDF::EncryptionData const& data)
{
    // Algorithm 3.12 from the PDF 1.7 extension level 3

    std::string user_data = data.getU().substr(0, 48);
    std::string owner_data = data.getO().substr(0, 32);
    std::string validation_salt = data.getO().substr(32, 8);
    std::string password = truncate_password_V5(owner_password);
    return (hash_V5(password, validation_salt, user_data, data) == owner_data);
}